

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O2

void TestUint32Conversions(void)

{
  char *in_RCX;
  
  CheckEqualsHelper((char *)0x38,0xc1c164,"Single(ordered).value()",2.9988165487136453e-38,in_RCX,
                    2.9988165487136453e-38);
  CheckEqualsHelper((char *)0x3b,0xc1c194,"Single(min_float32).value()",1.401298464324817e-45,in_RCX
                    ,1.401298464324817e-45);
  CheckEqualsHelper((char *)0x3e,0xc1c1b9,"Single(max_float32).value()",3.4028234663852886e+38,
                    in_RCX,3.4028234663852886e+38);
  return;
}

Assistant:

TEST(Uint32Conversions) {
  // Start by checking the byte-order.
  uint32_t ordered = 0x01234567;
  CHECK_EQ(2.9988165487136453e-38f, Single(ordered).value());

  uint32_t min_float32 = 0x00000001;
  CHECK_EQ(1.4e-45f, Single(min_float32).value());

  uint32_t max_float32 = 0x7f7fffff;
  CHECK_EQ(3.4028234e38f, Single(max_float32).value());
}